

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearResampler.cpp
# Opt level: O2

void __thiscall
SRCTools::LinearResampler::process
          (LinearResampler *this,FloatSample **inSamples,uint *inLength,FloatSample **outSamples,
          uint *outLength)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  double dVar4;
  FloatSample *pFVar5;
  uint chIx;
  long lVar6;
  double dVar7;
  
  if ((*inLength != 0) && (*outLength != 0)) {
    dVar4 = this->inputToOutputRatio;
    dVar7 = this->position;
    do {
      while (1.0 <= dVar7) {
        dVar7 = dVar7 + -1.0;
        this->position = dVar7;
        uVar3 = *inLength;
        *inLength = uVar3 - 1;
        pFVar5 = *inSamples;
        for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 4) {
          *(undefined4 *)((long)this->lastInputSamples + lVar6) =
               *(undefined4 *)((long)pFVar5 + lVar6);
        }
        *inSamples = pFVar5 + 2;
        if (uVar3 - 1 == 0) {
          return;
        }
      }
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        fVar1 = this->lastInputSamples[lVar6];
        fVar2 = (*inSamples)[lVar6];
        pFVar5 = *outSamples;
        *outSamples = pFVar5 + 1;
        *pFVar5 = (float)((double)(fVar2 - fVar1) * dVar7 + (double)fVar1);
      }
      *outLength = *outLength - 1;
      uVar3 = *outLength;
      dVar7 = dVar7 + dVar4;
      this->position = dVar7;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void LinearResampler::process(const FloatSample *&inSamples, unsigned int &inLength, FloatSample *&outSamples, unsigned int &outLength) {
	if (inLength == 0) return;
	while (outLength > 0) {
		while (1.0 <= position) {
			position--;
			inLength--;
			for (unsigned int chIx = 0; chIx < LINEAR_RESAMPER_CHANNEL_COUNT; ++chIx) {
				lastInputSamples[chIx] = *(inSamples++);
			}
			if (inLength == 0) return;
		}
		for (unsigned int chIx = 0; chIx < LINEAR_RESAMPER_CHANNEL_COUNT; chIx++) {
			*(outSamples++) = FloatSample(lastInputSamples[chIx] + position * (inSamples[chIx] - lastInputSamples[chIx]));
		}
		outLength--;
		position += inputToOutputRatio;
	}
}